

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.h
# Opt level: O2

Loop * uWS::Loop::get(void *existingNativeLoop)

{
  char *pcVar1;
  long *plVar2;
  Loop *pLVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  
  pcVar1 = (char *)__tls_get_addr(&PTR_0018fb40);
  if (*pcVar1 == '\0') {
    uVar4 = __tls_get_addr(&PTR_0018f8d8);
    __cxa_thread_atexit(LoopCleaner::~LoopCleaner,uVar4,&__dso_handle);
    puVar5 = (undefined1 *)__tls_get_addr(&PTR_0018fb40);
    *puVar5 = 1;
  }
  plVar2 = (long *)__tls_get_addr();
  pLVar3 = (Loop *)*plVar2;
  if (pLVar3 == (Loop *)0x0) {
    if (existingNativeLoop == (void *)0x0) {
      pLVar3 = create((void *)0x0);
      *plVar2 = (long)pLVar3;
      *(undefined1 *)(plVar2 + 1) = 1;
    }
    else {
      pLVar3 = create(existingNativeLoop);
      *plVar2 = (long)pLVar3;
    }
  }
  return pLVar3;
}

Assistant:

static Loop *get(void *existingNativeLoop = nullptr) {
        static thread_local LoopCleaner lazyLoop;
        if (!lazyLoop.loop) {
            /* If we are given a native loop pointer we pass that to uSockets and let it deal with it */
            if (existingNativeLoop) {
                /* Todo: here we want to pass the pointer, not a boolean */
                lazyLoop.loop = create(existingNativeLoop);
                /* We cannot register automatic free here, must be manually done */
            } else {
                lazyLoop.loop = create(nullptr);
                lazyLoop.cleanMe = true;
            }
        }

        return lazyLoop.loop;
    }